

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionEuler.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChBeamSectionEulerSimple::ComputeInertiaDampingMatrix
          (ChBeamSectionEulerSimple *this,ChMatrixNM<double,_6,_6> *Ri,ChVector<double> *mW)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong local_178;
  undefined8 uStack_170;
  ulong local_168;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
  local_158;
  Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false> local_138;
  undefined1 local_108 [56];
  undefined8 local_d0;
  undefined8 local_c8;
  ChMatrix33<double> mI;
  undefined1 local_78 [56];
  undefined8 local_40;
  undefined8 local_38;
  
  Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)Ri);
  if ((this->super_ChBeamSectionEuler).compute_inertia_damping_matrix != false) {
    if ((this->super_ChBeamSectionEuler).compute_Ri_Ki_by_num_diff == true) {
      ChBeamSectionEuler::ComputeInertiaDampingMatrix(&this->super_ChBeamSectionEuler,Ri,mW);
      return;
    }
    local_78._0_8_ = 0;
    local_78._24_8_ = mW->m_data[2];
    auVar2._0_8_ = -(double)local_78._24_8_;
    auVar2._8_4_ = 0;
    auVar2._12_4_ = 0x80000000;
    local_78._8_8_ = vmovlps_avx(auVar2);
    local_78._32_8_ = 0;
    auVar1 = *(undefined1 (*) [16])mW->m_data;
    local_78._16_8_ = mW->m_data[1];
    local_78._40_8_ = auVar1._0_8_ ^ 0x8000000000000000;
    local_78._48_4_ = auVar1._8_4_;
    local_78._52_4_ = auVar1._12_4_ ^ 0x80000000;
    local_40 = vmovlps_avx(auVar1);
    local_38 = 0;
    local_108._0_8_ = (this->Iyy + this->Izz) * this->density;
    local_108._8_8_ = this->density * (this->super_ChBeamSectionEuler).JzzJyy_factor * this->Area;
    local_108._16_8_ = local_108._8_8_;
    ChMatrix33<double>::ChMatrix33(&mI,(ChVector<double> *)local_108);
    ChMatrix33<double>::operator*(&mI,mW);
    local_108._0_8_ = 0.0;
    local_138.super_BlockImpl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_0>.m_data =
         (Ri->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array +
         0x15;
    auVar3._0_8_ = local_168 ^ 0x8000000000000000;
    auVar3._8_4_ = 0;
    auVar3._12_4_ = 0x80000000;
    local_108._8_8_ = vmovlps_avx(auVar3);
    auVar1._8_8_ = uStack_170;
    auVar1._0_8_ = local_178;
    local_108._32_8_ = 0;
    local_108._40_8_ = local_178 ^ 0x8000000000000000;
    local_108._48_4_ = (int)uStack_170;
    local_108._52_4_ = (uint)((ulong)uStack_170 >> 0x20) ^ 0x80000000;
    local_d0 = vmovlps_avx(auVar1);
    local_c8 = 0;
    local_138.super_BlockImpl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false,_true>.m_startRow.
    m_value = 3;
    local_138.super_BlockImpl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false,_true>.m_startCol.
    m_value = 3;
    local_138.super_BlockImpl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false,_true>.m_outerStride = 6
    ;
    local_158.m_lhs.m_lhs = (LhsNested)local_78;
    local_158.m_lhs.m_rhs = &mI.super_Matrix<double,_3,_3,_1,_3,_3>;
    local_158.m_rhs = (RhsNested)local_108;
    local_138.super_BlockImpl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false,_true>.m_xpr = Ri;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,3,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>const,Eigen::Matrix<double,3,3,1,3,3>const>>
              (&local_138,&local_158);
  }
  return;
}

Assistant:

void ChBeamSectionEulerSimple::ComputeInertiaDampingMatrix(ChMatrixNM<double, 6, 6>& Ri,  ///< 6x6 sectional inertial-damping (gyroscopic damping) matrix values here
		const ChVector<>& mW    ///< current angular velocity of section, in material frame
	) {
		Ri.setZero();
		if (compute_inertia_damping_matrix == false) 
			return;
		if (this->compute_Ri_Ki_by_num_diff)
			return ChBeamSectionEuler::ComputeInertiaDampingMatrix(Ri, mW);

		ChStarMatrix33<> wtilde(mW);   // [w~]
		// [I]  here a diagonal inertia, in Euler it should be Jzz = 0 Jyy = 0, but a tiny nonzero value avoids singularity:
		ChMatrix33<> mI(ChVector<>(
			(this->Iyy + this->Izz) * this->density,
			JzzJyy_factor * this->Area * this->density,
			JzzJyy_factor * this->Area * this->density));  
		Ri.block<3, 3>(3, 3) = wtilde * mI - ChStarMatrix33<>(mI * mW);  // Ri = [0, 0; 0, [w~][I] - [([I]*w)~]  ]
	}